

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>::templated_iterator<std::pair<std::type_index,_std::any>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
::emplace_new_key<std::pair<std::type_index,std::any>>
          (sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<std::type_index,_std::any> *key)

{
  any *this_00;
  char cVar1;
  _func_void__Op_any_ptr__Arg_ptr *p_Var2;
  type_info *ptVar3;
  EntryPointer psVar4;
  EntryPointer psVar5;
  type_index tVar6;
  EntryPointer psVar7;
  long lVar8;
  long lVar9;
  char __tmp;
  ulong uVar10;
  undefined7 in_register_00000031;
  char __tmp_1;
  sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
  sVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>::templated_iterator<std::pair<std::type_index,_std::any>_>,_bool>
  pVar14;
  value_type to_insert;
  _Arg __arg;
  pair<std::type_index,_std::any> local_58;
  any *local_40;
  _Arg local_38;
  
  if (*(long *)(this + 8) != 0) {
    uVar10 = CONCAT71(in_register_00000031,distance_from_desired) & 0xffffffff;
    sVar11 = SUB81(uVar10,0);
    if (this[0x11] != sVar11) {
      lVar9 = *(long *)(this + 0x18) + 1;
      auVar12._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar12._0_8_ = lVar9;
      auVar12._12_4_ = 0x45300000;
      lVar8 = *(long *)(this + 8) + 1;
      auVar13._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar13._0_8_ = lVar8;
      auVar13._12_4_ = 0x45300000;
      if ((auVar12._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0) <=
          (double)*(float *)(this + 0x14) *
          ((auVar13._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0))) {
        if (current_entry->distance_from_desired < '\0') {
          (current_entry->field_1).value.first._M_target = (key->first)._M_target;
          std::any::any(&(current_entry->field_1).value.second,&key->second);
          current_entry->distance_from_desired = (int8_t)sVar11;
          *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
          uVar10 = CONCAT71((int7)(uVar10 >> 8),1);
        }
        else {
          local_58.first._M_target = (key->first)._M_target;
          this_00 = &local_58.second;
          local_58.second._M_storage._M_ptr = (void *)0x0;
          p_Var2 = (key->second)._M_manager;
          if (p_Var2 == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
            local_58.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
          }
          else {
            local_38._M_any = this_00;
            (*p_Var2)(_Op_xfer,&key->second,&local_38);
          }
          cVar1 = current_entry->distance_from_desired;
          current_entry->distance_from_desired = (int8_t)sVar11;
          ptVar3 = (current_entry->field_1).value.first._M_target;
          (current_entry->field_1).value.first._M_target = local_58.first._M_target;
          local_40 = &(current_entry->field_1).value.second;
          local_58.first._M_target = ptVar3;
          std::any::swap(this_00,local_40);
          sVar11 = (sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
                    )(cVar1 + '\x01');
          cVar1 = current_entry[1].distance_from_desired;
          psVar7 = current_entry + 1;
          psVar5 = current_entry;
          tVar6._M_target = local_58.first._M_target;
          while (psVar4 = psVar7, local_58.first._M_target = tVar6._M_target, -1 < cVar1) {
            if (cVar1 < (char)sVar11) {
              psVar4->distance_from_desired = (int8_t)sVar11;
              local_58.first._M_target = (psVar4->field_1).value.first._M_target;
              (psVar4->field_1).value.first._M_target = tVar6._M_target;
              std::any::swap(this_00,&(psVar4->field_1).value.second);
              sVar11 = (sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
                        )(cVar1 + '\x01');
            }
            else {
              sVar11 = (sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
                        )((char)sVar11 + '\x01');
              if (sVar11 == this[0x11]) {
                local_58.first._M_target = (current_entry->field_1).value.first._M_target;
                (current_entry->field_1).value.first._M_target = tVar6._M_target;
                std::any::swap(this_00,local_40);
                sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
                ::grow((sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
                        *)this);
                pVar14 = emplace<std::pair<std::type_index,std::any>>(this,&local_58);
                current_entry = (EntryPointer)pVar14.first.current;
                uVar10 = (ulong)pVar14._8_4_;
                goto LAB_001739d2;
              }
            }
            psVar7 = psVar4 + 1;
            psVar5 = psVar4;
            tVar6._M_target = local_58.first._M_target;
            cVar1 = psVar4[1].distance_from_desired;
          }
          psVar5[1].field_1.value.first._M_target = tVar6._M_target;
          std::any::any(&psVar5[1].field_1.value.second,this_00);
          psVar4->distance_from_desired = (int8_t)sVar11;
          *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
          uVar10 = CONCAT71((int7)((ulong)psVar4 >> 8),1);
LAB_001739d2:
          if (local_58.second._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
            (*local_58.second._M_manager)(_Op_destroy,this_00,(_Arg *)0x0);
          }
        }
        goto LAB_00173882;
      }
    }
  }
  sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
  ::grow((sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
          *)this);
  pVar14 = emplace<std::pair<std::type_index,std::any>>(this,key);
  current_entry = (EntryPointer)pVar14.first.current;
  uVar10 = (ulong)pVar14._8_4_;
LAB_00173882:
  pVar14._8_8_ = uVar10 & 0xffffffff;
  pVar14.first.current = current_entry;
  return pVar14;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }